

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

bool __thiscall QPainter::hasClipping(QPainter *this)

{
  bool bVar1;
  QPainterPrivate *pQVar2;
  pointer pQVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  char local_28 [32];
  long local_8;
  int line;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QPainter *)0x5901f5);
  line = (int)((ulong)pQVar2 >> 0x20);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x59020b);
  if (bVar1) {
    pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59024a);
    bVar1 = false;
    if (((byte)pQVar3->field_0x1a0 >> 2 & 1) != 0) {
      pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x590271
                         );
      bVar1 = pQVar3->clipOperation != NoClip;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_RDI,line,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,
                                CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
    QMessageLogger::warning(local_28,"QPainter::hasClipping: Painter not active");
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QPainter::hasClipping() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::hasClipping: Painter not active");
        return false;
    }
    return d->state->clipEnabled && d->state->clipOperation != Qt::NoClip;
}